

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O3

string * decapitalize(string *__return_storage_ptr__,string *s,int pos)

{
  byte *pbVar1;
  pointer pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + s->_M_string_length);
  pbVar1 = (byte *)((__return_storage_ptr__->_M_dataplus)._M_p + pos);
  *pbVar1 = *pbVar1 | 0x20;
  return __return_storage_ptr__;
}

Assistant:

std::string decapitalize(const std::string &s, int pos) {
  std::string ret = s;
  ret[pos] |= 32;
  return ret;
}